

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenCircularImportsComponents_Test::TestBody
          (ModelFlattening_resolveFlattenCircularImportsComponents_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_878 [8];
  Message local_870 [8];
  undefined1 local_868 [16];
  AssertionResult gtest_ar_4;
  Message local_848 [8];
  shared_ptr<libcellml::Issue> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_3;
  Message local_7f8 [8];
  unsigned_long local_7f0 [2];
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_2;
  ModelPtr flatModel;
  Message local_7b8 [8];
  shared_ptr<libcellml::Issue> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_1;
  Message local_768 [8];
  unsigned_long local_760 [2];
  undefined1 local_750 [8];
  AssertionResult gtest_ar;
  string local_738 [32];
  string local_718 [32];
  undefined1 local_6f8 [8];
  ImporterPtr importer;
  string local_6e0 [32];
  string local_6c0 [32];
  undefined1 local_6a0 [8];
  ModelPtr originalModel;
  ParserPtr parser;
  string local_678 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  allocator<char> local_631;
  string local_630 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  allocator<char> local_5e9;
  string local_5e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  allocator<char> local_5a1;
  string local_5a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator<char> local_559;
  string local_558 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string flattenError;
  string local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_301;
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator<char> local_2b9;
  string local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator<char> local_229;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string resolveError;
  ModelFlattening_resolveFlattenCircularImportsComponents_Test *this_local;
  
  resolveError.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "Cyclic dependencies were found when attempting to resolve a component in the model \'importExample2b\'. The dependency loop is:\n"
             ,&local_1d1);
  std::operator+(&local_1b0,&local_1d0,
                 " - component \'sideB\' specifies an import from \':this:\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"modelflattening/",&local_229);
  resourcePath((string *)&local_208);
  std::operator+(&local_190,&local_1b0,&local_208);
  std::operator+(&local_170,&local_190,"circularImport1.cellml\';\n");
  std::operator+(&local_150,&local_170," - component \'shared\' specifies an import from \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"modelflattening/",&local_271);
  resourcePath((string *)&local_250);
  std::operator+(&local_130,&local_150,&local_250);
  std::operator+(&local_110,&local_130,"circularImport1.cellml\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"modelflattening/",&local_2b9);
  resourcePath((string *)&local_298);
  std::operator+(&local_f0,&local_110,&local_298);
  std::operator+(&local_d0,&local_f0,"circularImport2.cellml\'; and\n");
  std::operator+(&local_b0,&local_d0," - component \'circular2\' specifies an import from \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,"modelflattening/",&local_301);
  resourcePath((string *)&local_2e0);
  std::operator+(&local_90,&local_b0,&local_2e0);
  std::operator+(&local_70,&local_90,"circularImport2.cellml\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"modelflattening/",
             (allocator<char> *)(flattenError.field_2._M_local_buf + 0xf));
  resourcePath((string *)&local_328);
  std::operator+(&local_50,&local_70,&local_328);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"circularImport1.cellml\'.");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)(flattenError.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,
             "Cyclic dependencies were found when attempting to flatten a component in the model \'importExample2b\'. The dependency loop is:\n"
             ,&local_511);
  std::operator+(&local_4f0,&local_510,
                 " - component \'sideB\' specifies an import from \':this:\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_558,"modelflattening/",&local_559);
  resourcePath((string *)&local_538);
  std::operator+(&local_4d0,&local_4f0,&local_538);
  std::operator+(&local_4b0,&local_4d0,"circularImport1.cellml\';\n");
  std::operator+(&local_490,&local_4b0," - component \'shared\' specifies an import from \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"modelflattening/",&local_5a1);
  resourcePath((string *)&local_580);
  std::operator+(&local_470,&local_490,&local_580);
  std::operator+(&local_450,&local_470,"circularImport1.cellml\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"modelflattening/",&local_5e9);
  resourcePath((string *)&local_5c8);
  std::operator+(&local_430,&local_450,&local_5c8);
  std::operator+(&local_410,&local_430,"circularImport2.cellml\'; and\n");
  std::operator+(&local_3f0,&local_410," - component \'circular2\' specifies an import from \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_630,"modelflattening/",&local_631);
  resourcePath((string *)&local_610);
  std::operator+(&local_3d0,&local_3f0,&local_610);
  std::operator+(&local_3b0,&local_3d0,"circularImport2.cellml\' to \'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,"modelflattening/",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  resourcePath((string *)&local_658);
  std::operator+(&local_390,&local_3b0,&local_658);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                 &local_390,"circularImport1.cellml\'.");
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  this_00 = &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"modelflattening/importExample2b.cellml",
             (allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  fileContents(local_6c0);
  libcellml::Parser::parseModel((string *)local_6a0);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Importer::create
            (SUB81((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_6f8,0));
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,"modelflattening/",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_718);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_6a0);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_760[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_6f8);
  local_760[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_750,"size_t(1)","importer->issueCount()",local_760 + 1,
             local_760);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(local_768);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x366,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_6f8);
  libcellml::Logger::issue((ulong)&local_7b0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_7b0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_780,"resolveError","importer->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(local_7b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x367,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_7b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_6f8);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_2.message_);
  local_7f0[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_6f8);
  local_7f0[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_7e0,"size_t(1)","importer->issueCount()",local_7f0 + 1,
             local_7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(local_7f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x36b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_6f8);
  libcellml::Logger::issue((ulong)&local_840);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_840);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_810,"flattenError","importer->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
             &local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(local_848);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x36c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_868._0_8_ = (element_type *)0x0;
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_868 + 8,"nullptr",(void **)"flatModel",(shared_ptr<libcellml::Model> *)local_868,
             &gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_868 + 8));
  if (!bVar1) {
    testing::Message::Message(local_870);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_868 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x36d,pcVar3);
    testing::internal::AssertHelper::operator=(local_878,local_870);
    testing::internal::AssertHelper::~AssertHelper(local_878);
    testing::Message::~Message(local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_868 + 8));
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Importer>::~shared_ptr((shared_ptr<libcellml::Importer> *)local_6f8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_6a0);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenCircularImportsComponents)
{
    const std::string resolveError =
        std::string("Cyclic dependencies were found when attempting to resolve a component in the model 'importExample2b'. The dependency loop is:\n")
        + " - component 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1.cellml';\n"
        + " - component 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1.cellml' to '" + resourcePath("modelflattening/") + "circularImport2.cellml'; and\n"
        + " - component 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2.cellml' to '" + resourcePath("modelflattening/") + "circularImport1.cellml'.";

    const std::string flattenError =
        std::string("Cyclic dependencies were found when attempting to flatten a component in the model 'importExample2b'. The dependency loop is:\n")
        + " - component 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1.cellml';\n"
        + " - component 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1.cellml' to '" + resourcePath("modelflattening/") + "circularImport2.cellml'; and\n"
        + " - component 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2.cellml' to '" + resourcePath("modelflattening/") + "circularImport1.cellml'.";

    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("modelflattening/importExample2b.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve the imports.
    importer->resolveImports(originalModel, resourcePath("modelflattening/"));

    // Check for issues: expect one reporting the circular import.
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(resolveError, importer->issue(0)->description());

    // Create a flattened version to demonstrate the diagnostics.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(flattenError, importer->issue(0)->description());
    EXPECT_EQ(nullptr, flatModel);
}